

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

void deqp::gls::calcShaderColorCoord<int>
               (Vec2 *coord,Vec3 *color,Vector<int,_4> *attribValue,bool isCoordinate,
               int numComponents)

{
  int iVar1;
  int i;
  long lVar2;
  undefined7 in_register_00000009;
  float fVar3;
  Vector<float,_3> res;
  
  if ((int)CONCAT71(in_register_00000009,isCoordinate) == 0) {
    switch(numComponents + -1) {
    case 0:
      iVar1 = attribValue->m_data[0];
      res.m_data[2] = 0.0;
      res.m_data[0] = 0.0;
      res.m_data[1] = 0.0;
      lVar2 = 0;
      do {
        res.m_data[lVar2] = color->m_data[lVar2] * (float)iVar1;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      color->m_data[2] = res.m_data[2];
      *(undefined8 *)color->m_data = res.m_data._0_8_;
      return;
    case 1:
      *(ulong *)color->m_data =
           CONCAT44((float)(int)((ulong)*(undefined8 *)attribValue->m_data >> 0x20) *
                    (float)((ulong)*(undefined8 *)color->m_data >> 0x20),
                    (float)(int)*(undefined8 *)attribValue->m_data *
                    (float)*(undefined8 *)color->m_data);
      return;
    case 2:
      *(ulong *)color->m_data =
           CONCAT44((float)(int)((ulong)*(undefined8 *)attribValue->m_data >> 0x20) *
                    (float)((ulong)*(undefined8 *)color->m_data >> 0x20),
                    (float)(int)*(undefined8 *)attribValue->m_data *
                    (float)*(undefined8 *)color->m_data);
      color->m_data[2] = (float)attribValue->m_data[2] * color->m_data[2];
      return;
    case 3:
      fVar3 = (float)attribValue->m_data[3];
      *(ulong *)color->m_data =
           CONCAT44(fVar3 * (float)(int)((ulong)*(undefined8 *)attribValue->m_data >> 0x20) *
                            (float)((ulong)*(undefined8 *)color->m_data >> 0x20),
                    fVar3 * (float)(int)*(undefined8 *)attribValue->m_data *
                            (float)*(undefined8 *)color->m_data);
      color->m_data[2] = (float)attribValue->m_data[2] * color->m_data[2] * fVar3;
    }
  }
  else {
    switch(numComponents + -1) {
    case 0:
      iVar1 = attribValue->m_data[0];
      coord->m_data[0] = (float)iVar1;
      coord->m_data[1] = (float)iVar1;
      return;
    case 1:
      *(ulong *)coord->m_data =
           CONCAT44((float)(int)((ulong)*(undefined8 *)attribValue->m_data >> 0x20),
                    (float)(int)*(undefined8 *)attribValue->m_data);
      return;
    case 2:
      iVar1 = attribValue->m_data[1];
      coord->m_data[0] = (float)attribValue->m_data[2] + (float)attribValue->m_data[0];
      coord->m_data[1] = (float)iVar1;
      return;
    case 3:
      *(ulong *)coord->m_data =
           CONCAT44((float)(int)((ulong)*(undefined8 *)(attribValue->m_data + 2) >> 0x20) +
                    (float)(int)((ulong)*(undefined8 *)attribValue->m_data >> 0x20),
                    (float)(int)*(undefined8 *)(attribValue->m_data + 2) +
                    (float)(int)*(undefined8 *)attribValue->m_data);
      return;
    }
  }
  return;
}

Assistant:

void calcShaderColorCoord (tcu::Vec2& coord, tcu::Vec3& color, const tcu::Vector<T, 4>& attribValue, bool isCoordinate, int numComponents)
{
	if (isCoordinate)
		switch (numComponents)
		{
			case 1:	coord = tcu::Vec2((float)attribValue.x(),							(float)attribValue.x());							break;
			case 2:	coord = tcu::Vec2((float)attribValue.x(),							(float)attribValue.y());							break;
			case 3:	coord = tcu::Vec2((float)attribValue.x() + (float)attribValue.z(),	(float)attribValue.y());							break;
			case 4:	coord = tcu::Vec2((float)attribValue.x() + (float)attribValue.z(),	(float)attribValue.y() + (float)attribValue.w());	break;

			default:
				DE_ASSERT(false);
		}
	else
	{
		switch (numComponents)
		{
			case 1:
				color = color * (float)attribValue.x();
				break;

			case 2:
				color.x() = color.x() * (float)attribValue.x();
				color.y() = color.y() * (float)attribValue.y();
				break;

			case 3:
				color.x() = color.x() * (float)attribValue.x();
				color.y() = color.y() * (float)attribValue.y();
				color.z() = color.z() * (float)attribValue.z();
				break;

			case 4:
				color.x() = color.x() * (float)attribValue.x() * (float)attribValue.w();
				color.y() = color.y() * (float)attribValue.y() * (float)attribValue.w();
				color.z() = color.z() * (float)attribValue.z() * (float)attribValue.w();
				break;

			default:
				DE_ASSERT(false);
		}
	}
}